

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

void __thiscall fasttext::Matrix::divideRow(Matrix *this,Vector *denoms,int64_t ib,int64_t ie)

{
  pointer pfVar1;
  float fVar2;
  pointer pfVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  pointer pfVar16;
  int64_t iVar17;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  
  if (ie == -1) {
    ie = this->m_;
  }
  pfVar3 = (denoms->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ie <= (long)(denoms->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar3 >> 2) {
    if (ib < ie) {
      lVar4 = this->n_;
      auVar19 = vpbroadcastq_avx512vl();
      pfVar16 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + lVar4 * ib;
      auVar10 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar11 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      iVar17 = ib;
      do {
        fVar2 = pfVar3[iVar17 - ib];
        if (fVar2 != 0.0 && 0 < lVar4) {
          auVar22._4_4_ = fVar2;
          auVar22._0_4_ = fVar2;
          auVar22._8_4_ = fVar2;
          auVar22._12_4_ = fVar2;
          auVar22._16_4_ = fVar2;
          auVar22._20_4_ = fVar2;
          auVar22._24_4_ = fVar2;
          auVar22._28_4_ = fVar2;
          uVar18 = 0;
          do {
            auVar20 = vpbroadcastq_avx512vl();
            auVar21 = vpor_avx2(auVar20,auVar10);
            auVar20 = vpor_avx2(auVar20,auVar11);
            uVar12 = vpcmpuq_avx512vl(auVar20,auVar19,2);
            bVar15 = (byte)uVar12;
            uVar12 = vpcmpuq_avx512vl(auVar21,auVar19,2);
            bVar14 = (byte)uVar12;
            bVar13 = bVar14 << 4;
            pfVar1 = pfVar16 + uVar18;
            auVar21._4_4_ = (uint)((bVar15 & 2) >> 1) * (int)pfVar1[1];
            auVar21._0_4_ = (uint)(bVar15 & 1) * (int)*pfVar1;
            auVar21._8_4_ = (uint)((bVar15 & 4) >> 2) * (int)pfVar1[2];
            auVar21._12_4_ = (uint)((bVar15 & 0xf) >> 3) * (int)pfVar1[3];
            auVar21._16_4_ = (uint)(bVar14 & 1) * (int)pfVar1[4];
            auVar21._20_4_ = (uint)(bVar13 >> 5 & 1) * (int)pfVar1[5];
            auVar21._24_4_ = (uint)(bVar13 >> 6 & 1) * (int)pfVar1[6];
            auVar21._28_4_ = (uint)(bVar13 >> 7) * (int)pfVar1[7];
            auVar21 = vdivps_avx(auVar21,auVar22);
            pfVar1 = pfVar16 + uVar18;
            bVar5 = (bool)((bVar15 & 2) >> 1);
            bVar6 = (bool)((bVar15 & 4) >> 2);
            bVar7 = (bool)((bVar15 & 0xf) >> 3);
            bVar8 = (bool)(bVar13 >> 5 & 1);
            bVar9 = (bool)(bVar13 >> 6 & 1);
            *pfVar1 = (float)((uint)(bVar15 & 1) * auVar21._0_4_ |
                             (uint)!(bool)(bVar15 & 1) * (int)*pfVar1);
            pfVar1[1] = (float)((uint)bVar5 * auVar21._4_4_ | (uint)!bVar5 * (int)pfVar1[1]);
            pfVar1[2] = (float)((uint)bVar6 * auVar21._8_4_ | (uint)!bVar6 * (int)pfVar1[2]);
            pfVar1[3] = (float)((uint)bVar7 * auVar21._12_4_ | (uint)!bVar7 * (int)pfVar1[3]);
            pfVar1[4] = (float)((uint)(bVar14 & 1) * auVar21._16_4_ |
                               (uint)!(bool)(bVar14 & 1) * (int)pfVar1[4]);
            pfVar1[5] = (float)((uint)bVar8 * auVar21._20_4_ | (uint)!bVar8 * (int)pfVar1[5]);
            pfVar1[6] = (float)((uint)bVar9 * auVar21._24_4_ | (uint)!bVar9 * (int)pfVar1[6]);
            pfVar1[7] = (float)((uint)(bVar13 >> 7) * auVar21._28_4_ |
                               (uint)!(bool)(bVar13 >> 7) * (int)pfVar1[7]);
            uVar18 = uVar18 + 8;
          } while ((lVar4 + 7U & 0xfffffffffffffff8) != uVar18);
        }
        iVar17 = iVar17 + 1;
        pfVar16 = pfVar16 + lVar4;
      } while (iVar17 != ie);
    }
    return;
  }
  __assert_fail("ie <= denoms.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Lizhen0909[P]LSHVec/src/matrix.cc"
                ,0x4f,"void fasttext::Matrix::divideRow(const Vector &, int64_t, int64_t)");
}

Assistant:

void Matrix::divideRow(const Vector& denoms, int64_t ib, int64_t ie) {
  if (ie == -1) {
    ie = m_;
  }
  assert(ie <= denoms.size());
  for (auto i = ib; i < ie; i++) {
    real n = denoms[i - ib];
    if (n != 0) {
      for (auto j = 0; j < n_; j++) {
        at(i, j) /= n;
      }
    }
  }
}